

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pointer ppcVar4;
  cmCommandArgument *pcVar5;
  cmCommandArgument *this_00;
  cmCommandArgument *current;
  pointer __x;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    for (ppcVar4 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar4 !=
        (this->Arguments).
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
      cmCommandArgument::ApplyOwnGroup(*ppcVar4);
      pcVar5 = *ppcVar4;
      pcVar5->WasActive = false;
      pcVar5->CurrentIndex = 0;
      (*pcVar5->_vptr_cmCommandArgument[3])();
    }
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if (__x != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = (cmCommandArgument *)0x0;
      current = (cmCommandArgument *)0x0;
      do {
        for (ppcVar4 = (this->Arguments).
                       super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppcVar4 !=
            (this->Arguments).
            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
          this_00 = *ppcVar4;
          if ((this_00->Key == (char *)0x0) || (*this_00->Key == '\0')) {
LAB_0042f301:
            bVar1 = cmCommandArgument::MayFollow(this_00,current);
            if (bVar1) {
              this_00->WasActive = true;
              this_00->CurrentIndex = 0;
              uVar3 = 0;
              current = this_00;
              goto LAB_0042f346;
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)__x);
            if (iVar2 == 0) {
              this_00 = *ppcVar4;
              goto LAB_0042f301;
            }
          }
        }
        if (pcVar5 == (cmCommandArgument *)0x0) {
          if (unconsumedArgs !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(unconsumedArgs,__x);
          }
          pcVar5 = (cmCommandArgument *)0x0;
        }
        else {
          uVar3 = (ulong)pcVar5->CurrentIndex;
          current = pcVar5;
LAB_0042f346:
          iVar2 = (*current->_vptr_cmCommandArgument[2])(current,__x,uVar3);
          current->CurrentIndex = current->CurrentIndex + 1;
          pcVar5 = (cmCommandArgument *)0x0;
          if ((char)iVar2 == '\0') {
            pcVar5 = current;
          }
        }
        __x = __x + 1;
      } while (__x != (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == CM_NULLPTR) {
    return;
  }

  for (std::vector<cmCommandArgument*>::iterator argIt =
         this->Arguments.begin();
       argIt != this->Arguments.end(); ++argIt) {
    (*argIt)->ApplyOwnGroup();
    (*argIt)->Reset();
  }

  cmCommandArgument* activeArgument = CM_NULLPTR;
  const cmCommandArgument* previousArgument = CM_NULLPTR;
  for (std::vector<std::string>::const_iterator it = args->begin();
       it != args->end(); ++it) {
    for (std::vector<cmCommandArgument*>::iterator argIt =
           this->Arguments.begin();
         argIt != this->Arguments.end(); ++argIt) {
      if ((*argIt)->KeyMatches(*it) &&
          ((*argIt)->MayFollow(previousArgument))) {
        activeArgument = *argIt;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(*it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = CM_NULLPTR;
      }
    } else {
      if (unconsumedArgs != CM_NULLPTR) {
        unconsumedArgs->push_back(*it);
      }
    }
  }
}